

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

shared_ptr<rcg::Device> __thiscall
rcg::Interface::getDevice(Interface *this,char *devid,uint64_t timeout)

{
  bool bVar1;
  int iVar2;
  string *__lhs;
  ostream *poVar3;
  Device *this_00;
  uint64_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar4;
  long lVar5;
  shared_ptr<rcg::Device> sVar6;
  shared_ptr<rcg::Device> p;
  string local_88;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> list;
  string local_50;
  
  getDevices(&list,(Interface *)devid,in_RCX);
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)list.
                            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)list.
                            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
    std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((list.
                         super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar5))
    ;
    if (p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      __lhs = Device::getID_abi_cxx11_
                        (p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==(__lhs,(char *)timeout);
      if (!bVar1) {
        Device::getDisplayName_abi_cxx11_
                  (&local_88,p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar1 = std::operator==(&local_88,(char *)timeout);
        if (bVar1) {
          std::__cxx11::string::~string((string *)&local_88);
        }
        else {
          Device::getSerialNumber_abi_cxx11_
                    (&local_50,p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          bVar1 = std::operator==(&local_50,(char *)timeout);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_88);
          if (!bVar1) goto LAB_0010c01b;
        }
      }
      if ((this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
          super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
         ) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "There is more than one device with ID, serial number or user defined name: "
                                );
        poVar3 = std::operator<<(poVar3,(char *)timeout);
        std::endl<char,std::char_traits<char>>(poVar3);
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 0;
        std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        break;
      }
      std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>);
    }
LAB_0010c01b:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    lVar5 = lVar5 + 0x10;
  }
  if (((this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
       super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
     && (*(long *)(devid + 0x80) != 0)) {
    p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    iVar2 = (**(code **)(*(long *)(devid + 0x20) + 0xe8))(*(long *)(devid + 0x80),timeout,2);
    if (1 < iVar2 + 0x3edU) {
      if (iVar2 != 0) goto LAB_0010c13e;
      (*((((shared_ptr<const_rcg::GenTLWrapper> *)(devid + 0x20))->
         super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->DevClose)
                (p.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this_00 = (Device *)operator_new(0x130);
    std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Interface,void>
              ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)devid);
    Device::Device(this_00,(shared_ptr<rcg::Interface> *)&local_50,
                   (shared_ptr<const_rcg::GenTLWrapper> *)(devid + 0x20),(char *)timeout);
    std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
              ((__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&local_88,this_00);
    std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  }
LAB_0010c13e:
  std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::~vector
            (&list);
  sVar6.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<rcg::Device>)sVar6.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Device> Interface::getDevice(const char *devid, uint64_t timeout)
{
  // get list of all devices

  std::vector<std::shared_ptr<Device> > list=getDevices(timeout);

  // find requested device by ID or user defined name

  std::shared_ptr<Device> ret;

  for (size_t i=0; i<list.size(); i++)
  {
    std::shared_ptr<Device> p=list[i];

    if (p && (p->getID() == devid || p->getDisplayName() == devid ||
              p->getSerialNumber() == devid))
    {
      if (ret)
      {
        std::cerr << "There is more than one device with ID, serial number or user defined name: "
                  << devid << std::endl;
        ret=0;
        break;
      }

      ret=p;
    }
  }

  if (!ret && ifh != 0)
  {
    // try to open the device in a last attempt to check if the producer is
    // able to find it

    GenTL::DEV_HANDLE dev=0;

    GenTL::GC_ERROR err=gentl->IFOpenDevice(ifh, devid, GenTL::DEVICE_ACCESS_READONLY, &dev);

    if (err == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DevClose(dev);
    }

    if (err == GenTL::GC_ERR_SUCCESS || err == GenTL::GC_ERR_RESOURCE_IN_USE ||
        err == GenTL::GC_ERR_ACCESS_DENIED)
    {
      ret=std::shared_ptr<Device>(new Device(shared_from_this(), gentl, devid));
    }
  }

  return ret;
}